

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beman_s_challenge.cc
# Opt level: O0

int main(void)

{
  vec2f vVar1;
  vec<float,_2UL> vVar2;
  vec<float,_2UL> rhs;
  vec<float,_2UL> rhs_00;
  vec<float,_2UL> rhs_01;
  vec<float,_2UL> rhs_02;
  string_view title;
  color4f color;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  add_pointer_t<hmi::window_events::closed> ptVar6;
  add_pointer_t<hmi::window_events::mouse_button_released> ptVar7;
  add_pointer_t<hmi::window_events::mouse_moved> ptVar8;
  add_pointer_t<hmi::window_events::resized> ptVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  vec2f pixel_position;
  vec2i index;
  add_pointer_t<hmi::window_events::resized> pevent_2;
  vec2f new_cursor;
  vec2f old_cursor;
  add_pointer_t<hmi::window_events::mouse_moved> pevent_1;
  vec2f cursor;
  add_pointer_t<hmi::window_events::mouse_button_pressed> pevent;
  variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
  *event;
  optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  maybe_event;
  vec2f mouse_position;
  bool dragging;
  vec2f position;
  vec2f size;
  vec2f pixel_size;
  vec2i hello_size;
  renderer renderer;
  window window;
  window *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  window *this;
  undefined1 in_stack_fffffffffffffdc8 [16];
  anon_union_16_9_0ab46d14_for_vec<float,_4UL>_2 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffe08 [16];
  undefined8 in_stack_fffffffffffffe58;
  window_flags hints;
  window *in_stack_fffffffffffffe60;
  anon_union_8_5_712f1eca_for_vec<int,_2UL>_2 in_stack_fffffffffffffe68;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 in_stack_fffffffffffffe70;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 in_stack_fffffffffffffe78;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 aVar13;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 in_stack_fffffffffffffe90;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 coords;
  vec2f local_150;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_e8;
  add_pointer_t<hmi::window_events::mouse_button_pressed> local_e0;
  variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
  *local_d8;
  vec<float,_2UL> local_bc;
  byte local_b1;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_b0;
  anon_union_8_5_712f1eca_for_vec<int,_2UL>_2 local_a8;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_a0;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_98;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_90;
  anon_union_8_5_712f1eca_for_vec<int,_2UL>_2 local_88;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_7c;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_74;
  anon_union_8_5_712f1eca_for_vec<int,_2UL>_2 local_6c [2];
  renderer local_58;
  vec<int,_2UL> local_30 [3];
  window local_18;
  int local_4;
  
  hints = (window_flags)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  local_4 = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffdc8._8_8_,in_stack_fffffffffffffdc8._0_8_);
  hmi::vec<int,_2UL>::vec(local_30,0x400,0x240);
  title._M_str = (char *)in_stack_fffffffffffffe78;
  title._M_len = (size_t)in_stack_fffffffffffffe70;
  hmi::window::window(in_stack_fffffffffffffe60,title,(vec2i)in_stack_fffffffffffffe68,hints);
  hmi::window::get_renderer(in_stack_fffffffffffffdb8);
  sVar5 = strlen(g_hello_text[0]);
  hmi::vec<int,_2UL>::vec((vec<int,_2UL> *)&local_6c[0].x,(int)sVar5,5);
  hmi::vec<float,_2UL>::vec((vec<float,_2UL> *)&local_74.x,10.0,9.708204);
  local_88 = local_6c[0];
  local_90 = local_74;
  vVar2.field_0.data[1] = (float)in_stack_fffffffffffffdc4;
  vVar2.field_0.data[0] = (float)in_stack_fffffffffffffdc0;
  local_7c.x.data =
       (vec_accessor<float,_2UL,_0UL>)
       hmi::operator*((vec<int,_2UL>)in_stack_fffffffffffffdc8._0_8_,vVar2);
  local_a8.x.data =
       (vec_accessor<int,_2UL,_0UL>)hmi::window::get_size(in_stack_fffffffffffffdc8._0_8_);
  local_b0.data = local_7c.data;
  rhs.field_0.data[1] = (float)in_stack_fffffffffffffdc4;
  rhs.field_0.data[0] = (float)in_stack_fffffffffffffdc0;
  local_a0.x.data =
       (vec_accessor<float,_2UL,_0UL>)
       hmi::operator-((vec<int,_2UL>)in_stack_fffffffffffffdc8._0_8_,rhs);
  local_98.data =
       (float  [2])hmi::operator/(in_stack_fffffffffffffdc8._0_8_,in_stack_fffffffffffffdc4);
  local_b1 = 0;
  hmi::vec<float,_2UL>::vec(&local_bc,0.0,0.0);
  while( true ) {
    bVar3 = hmi::window::is_open(&local_18);
    this = in_stack_fffffffffffffdc8._0_8_;
    if (!bVar3) break;
    while( true ) {
      iVar4 = (int)&local_18;
      hmi::window::poll_event(in_stack_fffffffffffffe08._8_8_);
      bVar3 = std::optional::operator_cast_to_bool
                        ((optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                          *)0x102730);
      if (!bVar3) break;
      local_d8 = std::
                 optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                 ::value((optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                          *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      ptVar6 = std::
               get_if<hmi::window_events::closed,hmi::window_events::resized,hmi::window_events::closed,hmi::window_events::focus_gained,hmi::window_events::focus_lost,hmi::window_events::keyboard_key_pressed,hmi::window_events::keyboard_key_repeated,hmi::window_events::keyboard_key_released,hmi::window_events::mouse_button_pressed,hmi::window_events::mouse_button_released,hmi::window_events::mouse_moved,hmi::window_events::mouse_wheel_scrolled,hmi::window_events::mouse_entered,hmi::window_events::mouse_left>
                         ((variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                           *)0x102767);
      if (ptVar6 == (add_pointer_t<hmi::window_events::closed>)0x0) {
        local_e0 = std::
                   get_if<hmi::window_events::mouse_button_pressed,hmi::window_events::resized,hmi::window_events::closed,hmi::window_events::focus_gained,hmi::window_events::focus_lost,hmi::window_events::keyboard_key_pressed,hmi::window_events::keyboard_key_repeated,hmi::window_events::keyboard_key_released,hmi::window_events::mouse_button_pressed,hmi::window_events::mouse_button_released,hmi::window_events::mouse_moved,hmi::window_events::mouse_wheel_scrolled,hmi::window_events::mouse_entered,hmi::window_events::mouse_left>
                             ((variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                               *)0x1027cd);
        if (local_e0 == (add_pointer_t<hmi::window_events::mouse_button_pressed>)0x0) {
          ptVar7 = std::
                   get_if<hmi::window_events::mouse_button_released,hmi::window_events::resized,hmi::window_events::closed,hmi::window_events::focus_gained,hmi::window_events::focus_lost,hmi::window_events::keyboard_key_pressed,hmi::window_events::keyboard_key_repeated,hmi::window_events::keyboard_key_released,hmi::window_events::mouse_button_pressed,hmi::window_events::mouse_button_released,hmi::window_events::mouse_moved,hmi::window_events::mouse_wheel_scrolled,hmi::window_events::mouse_entered,hmi::window_events::mouse_left>
                             ((variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                               *)0x102959);
          if (ptVar7 == (add_pointer_t<hmi::window_events::mouse_button_released>)0x0) {
            ptVar8 = std::
                     get_if<hmi::window_events::mouse_moved,hmi::window_events::resized,hmi::window_events::closed,hmi::window_events::focus_gained,hmi::window_events::focus_lost,hmi::window_events::keyboard_key_pressed,hmi::window_events::keyboard_key_repeated,hmi::window_events::keyboard_key_released,hmi::window_events::mouse_button_pressed,hmi::window_events::mouse_button_released,hmi::window_events::mouse_moved,hmi::window_events::mouse_wheel_scrolled,hmi::window_events::mouse_entered,hmi::window_events::mouse_left>
                               ((variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                                 *)0x102979);
            if (ptVar8 == (add_pointer_t<hmi::window_events::mouse_moved>)0x0) {
              ptVar9 = std::
                       get_if<hmi::window_events::resized,hmi::window_events::resized,hmi::window_events::closed,hmi::window_events::focus_gained,hmi::window_events::focus_lost,hmi::window_events::keyboard_key_pressed,hmi::window_events::keyboard_key_repeated,hmi::window_events::keyboard_key_released,hmi::window_events::mouse_button_pressed,hmi::window_events::mouse_button_released,hmi::window_events::mouse_moved,hmi::window_events::mouse_wheel_scrolled,hmi::window_events::mouse_entered,hmi::window_events::mouse_left>
                                 ((variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
                                   *)0x102aa4);
              if (ptVar9 != (add_pointer_t<hmi::window_events::resized>)0x0) {
                hmi::vec<float,_2UL>::vec<int>
                          ((vec<float,_2UL> *)
                           CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                           (vec<int,_2UL> *)in_stack_fffffffffffffdb8);
                hmi::renderer::set_view_size(&local_58,local_150);
              }
            }
            else {
              if ((local_b1 & 1) != 0) {
                hmi::vec<int,_2UL>::vec<float>
                          ((vec<int,_2UL> *)
                           CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                           (vec<float,_2UL> *)in_stack_fffffffffffffdb8);
                vVar1 = hmi::renderer::get_coords_from_position
                                  ((renderer *)in_stack_fffffffffffffe70,
                                   (vec2i)in_stack_fffffffffffffe78.x.data);
                in_stack_fffffffffffffdd8.data[2] = (float)extraout_XMM0_Dc_00;
                in_stack_fffffffffffffdd8._0_8_ = vVar1.field_0;
                in_stack_fffffffffffffdd8.data[3] = (float)extraout_XMM0_Dd_00;
                vVar1 = hmi::renderer::get_coords_from_position
                                  ((renderer *)in_stack_fffffffffffffe70,
                                   (vec2i)in_stack_fffffffffffffe78.x.data);
                in_stack_fffffffffffffdc8._8_4_ = extraout_XMM0_Dc_01;
                in_stack_fffffffffffffdc8._0_8_ = vVar1.field_0;
                in_stack_fffffffffffffdc8._12_4_ = extraout_XMM0_Dd_01;
                rhs_00.field_0.data[1] = (float)in_stack_fffffffffffffdc4;
                rhs_00.field_0.data[0] = (float)in_stack_fffffffffffffdc0;
                hmi::operator-((vec<float,_2UL>)vVar1.field_0,rhs_00);
                hmi::operator+=(in_stack_fffffffffffffdc8._0_8_,
                                (vec<float,_2UL>)in_stack_fffffffffffffdc8._8_8_);
              }
              hmi::vec<float,_2UL>::vec<int>
                        ((vec<float,_2UL> *)
                         CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                         (vec<int,_2UL> *)in_stack_fffffffffffffdb8);
            }
          }
          else {
            local_b1 = 0;
          }
        }
        else {
          local_e8.data =
               (float  [2])
               hmi::renderer::get_coords_from_position
                         (in_stack_fffffffffffffe70.data,in_stack_fffffffffffffe78.data);
          in_stack_fffffffffffffe08._8_4_ = extraout_XMM0_Dc;
          in_stack_fffffffffffffe08._0_8_ = local_e8;
          in_stack_fffffffffffffe08._12_4_ = extraout_XMM0_Dd;
          fVar10 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_98.x);
          fVar11 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_e8.x);
          if (fVar10 <= fVar11) {
            fVar10 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_e8.x);
            fVar11 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_98.x);
            fVar12 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_7c.x);
            if (fVar10 <= fVar11 + fVar12) {
              fVar10 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_98.x);
              fVar11 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_e8.x);
              if (fVar10 <= fVar11) {
                fVar10 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_e8.x);
                fVar11 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_98.x);
                fVar12 = hmi::vec_accessor::operator_cast_to_float((vec_accessor *)&local_7c.x);
                if (fVar10 <= fVar11 + fVar12) {
                  local_b1 = 1;
                  hmi::vec<float,_2UL>::vec<int>
                            ((vec<float,_2UL> *)
                             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                             (vec<int,_2UL> *)in_stack_fffffffffffffdb8);
                }
              }
            }
          }
        }
      }
      else {
        hmi::window::close(&local_18,iVar4);
      }
    }
    hmi::renderer::clear(in_stack_fffffffffffffdc8._8_8_,(color4f)in_stack_fffffffffffffdd8.x.data);
    hmi::vec<int,_2UL>::vec((vec<int,_2UL> *)&stack0xfffffffffffffe90);
    hmi::vec_accessor<int,_2UL,_1UL>::operator=
              ((vec_accessor<int,_2UL,_1UL> *)&stack0xfffffffffffffe90,0);
    while( true ) {
      in_stack_fffffffffffffdc4 =
           hmi::vec_accessor::operator_cast_to_int((vec_accessor *)&stack0xfffffffffffffe90);
      iVar4 = hmi::vec_accessor::operator_cast_to_int((vec_accessor *)&local_6c[0].x);
      if (iVar4 <= in_stack_fffffffffffffdc4) break;
      hmi::vec_accessor<int,_2UL,_0UL>::operator=
                ((vec_accessor<int,_2UL,_0UL> *)&stack0xfffffffffffffe90,0);
      while( true ) {
        in_stack_fffffffffffffdc0 =
             hmi::vec_accessor::operator_cast_to_int((vec_accessor *)&stack0xfffffffffffffe90);
        iVar4 = hmi::vec_accessor::operator_cast_to_int((vec_accessor *)&local_6c[0].x);
        if (iVar4 <= in_stack_fffffffffffffdc0) break;
        iVar4 = hmi::vec_accessor::operator_cast_to_int((vec_accessor *)&stack0xfffffffffffffe90);
        in_stack_fffffffffffffdb8 = (window *)g_hello_text[iVar4];
        iVar4 = hmi::vec_accessor::operator_cast_to_int((vec_accessor *)&stack0xfffffffffffffe90);
        if (*(char *)((long)&in_stack_fffffffffffffdb8->m_window + (long)iVar4) == '#') {
          rhs_01.field_0.data[1] = (float)in_stack_fffffffffffffdc4;
          rhs_01.field_0.data[0] = (float)in_stack_fffffffffffffdc0;
          aVar13 = local_98;
          coords = in_stack_fffffffffffffe90;
          in_stack_fffffffffffffe78.x.data =
               (vec_accessor<float,_2UL,_0UL>)
               hmi::operator*((vec<int,_2UL>)in_stack_fffffffffffffdc8._0_8_,rhs_01);
          rhs_02.field_0.data[1] = (float)in_stack_fffffffffffffdc4;
          rhs_02.field_0.data[0] = (float)in_stack_fffffffffffffdc0;
          vVar2 = hmi::operator+((vec<float,_2UL>)in_stack_fffffffffffffdc8._0_8_,rhs_02);
          color.field_0._8_8_ = aVar13;
          color.field_0._0_8_ = in_stack_fffffffffffffe78;
          hmi::renderer::fill_rectangle
                    ((renderer *)in_stack_fffffffffffffe90,(vec2f)coords.x.data,(vec2f)vVar2.field_0
                     ,color);
          in_stack_fffffffffffffe70 = in_stack_fffffffffffffe90;
          in_stack_fffffffffffffe90 = coords;
        }
        hmi::vec_accessor<int,_2UL,_0UL>::operator++
                  ((vec_accessor<int,_2UL,_0UL> *)&stack0xfffffffffffffe90);
      }
      hmi::vec_accessor<int,_2UL,_1UL>::operator++
                ((vec_accessor<int,_2UL,_1UL> *)&stack0xfffffffffffffe90,0);
    }
    hmi::renderer::display((renderer *)0x102cfc);
  }
  local_4 = 0;
  hmi::renderer::~renderer
            ((renderer *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  hmi::window::~window(this);
  return local_4;
}

Assistant:

int main() {
  hmi::window window("Beman's challenge", { 1024, 576 });

  auto renderer = window.get_renderer();

  hmi::vec2i hello_size = { static_cast<int>(std::strlen(g_hello_text[0])), 5 };
  hmi::vec2f pixel_size = { 10.0f, 10.0f * 3 / 5 * 1.61803398875f };
  hmi::vec2f size = hello_size * pixel_size;

  hmi::vec2f position = (window.get_size() - size) / 2;
  bool dragging = false;
  hmi::vec2f mouse_position = { 0, 0 };

  while (window.is_open()) {

    while (auto maybe_event = window.poll_event()) {
      auto& event = maybe_event.value();

      if (std::get_if<hmi::window_events::closed>(&event)) {
        window.close();
      } else if (auto pevent = std::get_if<hmi::window_events::mouse_button_pressed>(&event)) {
        hmi::vec2f cursor = renderer.get_coords_from_position(pevent->position);

        if (position.x <= cursor.x && cursor.x <= position.x + size.width && position.y <= cursor.y && cursor.y <= position.y + size.height) {
          dragging = true;
          mouse_position = pevent->position;
        }
      } else if (std::get_if<hmi::window_events::mouse_button_released>(&event)) {
        dragging = false;
      } else if (auto pevent = std::get_if<hmi::window_events::mouse_moved>(&event)) {
        if (dragging) {
          hmi::vec2f old_cursor = renderer.get_coords_from_position(mouse_position);
          hmi::vec2f new_cursor = renderer.get_coords_from_position(pevent->position);
          position += (new_cursor - old_cursor);
        }

        mouse_position = pevent->position;
      } else if (auto pevent = std::get_if<hmi::window_events::resized>(&event)) {
        renderer.set_view_size(pevent->size);
      }

    }

    renderer.clear(hmi::color::white);

    hmi::vec2i index;

    for (index.y = 0; index.y < hello_size.height; index.y++) {
      for (index.x = 0; index.x < hello_size.width; ++index.x) {
        if (g_hello_text[index.y][index.x] == '#') {
          hmi::vec2f pixel_position = position + index * pixel_size;
          renderer.fill_rectangle(pixel_position, pixel_size, hmi::color::red);
        }
      }
    }

    renderer.display();
  }

  return 0;
}